

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MixedBindingCase::createBuffers(MixedBindingCase *this)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int x;
  long lVar12;
  Vec4 *color;
  undefined8 *puVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> positionData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  allocator_type local_89;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_88;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_70;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long lVar7;
  
  iVar5 = (*((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  local_48 = 0x3f80000000000000;
  uStack_40 = 0x3f80000000000000;
  local_58 = 0x3f8000003f800000;
  uStack_50 = 0x3f80000000000000;
  bVar17 = 1 < this->m_case - CASE_INSTANCED_BINDING;
  uVar14 = 400;
  if (!bVar17) {
    uVar14 = 1;
  }
  uVar16 = (uint)bVar17 * 5 + 1;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_88,(ulong)(uVar14 * 6),(allocator_type *)&local_70);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_70,(ulong)(uVar16 * 800),&local_89);
  uVar8 = (ulong)uVar14;
  lVar9 = 0;
  do {
    puVar13 = (undefined8 *)
              ((long)(local_88.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar9);
    *puVar13 = 0;
    puVar13[1] = 0x3f80000000000000;
    puVar13 = (undefined8 *)
              ((long)local_88.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar9);
    *puVar13 = 0x3dcccccd00000000;
    puVar13[1] = 0x3f80000000000000;
    puVar13 = (undefined8 *)
              ((long)local_88.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar9);
    *puVar13 = 0x3dcccccd3dcccccd;
    puVar13[1] = 0x3f80000000000000;
    puVar13 = (undefined8 *)
              ((long)local_88.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar9);
    *puVar13 = 0;
    puVar13[1] = 0x3f80000000000000;
    puVar13 = (undefined8 *)
              ((long)local_88.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar9);
    *puVar13 = 0x3dcccccd3dcccccd;
    puVar13[1] = 0x3f80000000000000;
    puVar13 = (undefined8 *)
              ((long)local_88.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[5].m_data + lVar9);
    *puVar13 = 0x3dcccccd;
    puVar13[1] = 0x3f80000000000000;
    lVar9 = lVar9 + 0x60;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
  lVar9 = 0;
  lVar10 = 0;
  do {
    fVar18 = (float)(int)lVar10 / 20.0;
    lVar12 = 0;
    lVar11 = lVar9;
    do {
      puVar13 = &local_58;
      if (((int)lVar12 + (int)lVar10 & 1U) == 0) {
        puVar13 = &local_48;
      }
      fVar19 = (float)(int)lVar12 / 20.0;
      uVar8 = (ulong)uVar16;
      lVar15 = lVar11;
      do {
        uVar2 = *(undefined4 *)((long)puVar13 + 4);
        uVar3 = *(undefined4 *)(puVar13 + 1);
        uVar4 = *(undefined4 *)((long)puVar13 + 0xc);
        puVar1 = (undefined4 *)
                 ((long)(local_70.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar15);
        *puVar1 = *(undefined4 *)puVar13;
        puVar1[1] = uVar2;
        puVar1[2] = uVar3;
        puVar1[3] = uVar4;
        *(float *)((long)local_70.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar15) =
             fVar19 + fVar19 + -1.0;
        *(float *)((long)local_70.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar15 + 4) =
             fVar18 + fVar18 + -1.0;
        *(undefined8 *)
         ((long)local_70.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start[1].m_data + lVar15 + 8) = 0;
        lVar15 = lVar15 + 0x20;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + (ulong)(uVar16 * 0x20);
    } while (lVar12 != 0x14);
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + (ulong)(uVar16 * 0x80) * 5;
  } while (lVar10 != 0x14);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_posBuffer);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_posBuffer);
  (**(code **)(lVar7 + 0x150))
            (0x8892,(long)((int)local_88.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_88.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_88.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x413);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_colorOffsetBuffer);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_colorOffsetBuffer);
  (**(code **)(lVar7 + 0x150))
            (0x8892,(long)((int)local_70.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (int)local_70.
                               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0,
             local_70.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start,0x88e4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"upload position data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x418);
  if (local_70.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MixedBindingCase::createBuffers (void)
{
	const glw::Functions&	gl								= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green							= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow							= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	// draw grid. In instanced mode, each cell is an instance
	const bool				instanced						= (m_case == CASE_INSTANCED_BINDING) || (m_case == CASE_INSTANCED_ATTRIB);
	const int				numCells						= GRID_SIZE*GRID_SIZE;
	const int				numPositionCells				= (instanced) ? (1) : (numCells);
	const int				numPositionElements				= 6 * numPositionCells;
	const int				numInstanceElementsPerCell		= (instanced) ? (1) : (6);
	const int				numColorOffsetElements			= numInstanceElementsPerCell * numCells;

	std::vector<tcu::Vec4>	positionData					(numPositionElements);
	std::vector<tcu::Vec4>	colorOffsetData					(2 * numColorOffsetElements);

	// positions

	for (int primNdx = 0; primNdx < numPositionCells; ++primNdx)
	{
		positionData[primNdx*6 + 0] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 1] =  tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 2] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 3] =  tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		positionData[primNdx*6 + 4] =  tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		positionData[primNdx*6 + 5] =  tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}

	// color & offset

	for (int y = 0; y < GRID_SIZE; ++y)
	for (int x = 0; x < GRID_SIZE; ++x)
	{
		for (int v = 0; v < numInstanceElementsPerCell; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 0] = color;
			colorOffsetData[((y * GRID_SIZE + x) * numInstanceElementsPerCell + v) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_posBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_posBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(positionData.size() * sizeof(tcu::Vec4)), positionData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");

	gl.genBuffers(1, &m_colorOffsetBuffer);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuffer);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload position data");
}